

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSphereShape.cpp
# Opt level: O0

void __thiscall
btSphereShape::calculateLocalInertia(btSphereShape *this,btScalar mass,btVector3 *inertia)

{
  btVector3 *in_RSI;
  long *in_RDI;
  float in_XMM0_Da;
  float fVar1;
  btScalar elem;
  float local_1c;
  btVector3 *local_18;
  
  local_18 = in_RSI;
  fVar1 = (float)(**(code **)(*in_RDI + 0x60))();
  local_1c = (float)(**(code **)(*in_RDI + 0x60))();
  local_1c = in_XMM0_Da * 0.4 * fVar1 * local_1c;
  btVector3::setValue(local_18,&local_1c,&local_1c,&local_1c);
  return;
}

Assistant:

void	btSphereShape::calculateLocalInertia(btScalar mass,btVector3& inertia) const
{
	btScalar elem = btScalar(0.4) * mass * getMargin()*getMargin();
	inertia.setValue(elem,elem,elem);

}